

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O2

void __thiscall Network::Network(Network *this)

{
  Network_param *pNVar1;
  Clock *pCVar2;
  Logging *pLVar3;
  
  (this->synapses).super__Vector_base<Synapse_*,_std::allocator<Synapse_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->synapses).super__Vector_base<Synapse_*,_std::allocator<Synapse_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->synapses).super__Vector_base<Synapse_*,_std::allocator<Synapse_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar1 = (Network_param *)operator_new(8);
  pNVar1->dt = 0.01;
  this->param = pNVar1;
  (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar2 = Clock::getInstance();
  this->clock = pCVar2;
  pLVar3 = Logging::getInstance();
  this->logger = pLVar3;
  return;
}

Assistant:

Network::Network() : 
    param(new Network_param())
{
    clock = Clock::getInstance();
    logger = Logging::getInstance();
}